

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Functional::UniformCase::generateVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,UniformCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms)

{
  CaseShaderType CVar1;
  UniformCase *this_00;
  ostringstream result;
  undefined1 local_1a0 [376];
  
  CVar1 = this->m_caseShaderType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "#version 300 es\nin highp vec4 a_position;\nout mediump float v_vtxOut;\n\n",0x47);
  if ((CVar1 & ~CASESHADERTYPE_BOTH) == CASESHADERTYPE_VERTEX) {
    writeUniformDefinitions(this,(ostringstream *)local_1a0);
  }
  this_00 = (UniformCase *)local_1a0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_vtxOut = 1.0;\n",0x40);
  if ((CVar1 & ~CASESHADERTYPE_BOTH) == CASESHADERTYPE_VERTEX) {
    writeUniformComparisons(this_00,(ostringstream *)local_1a0,basicUniforms,"v_vtxOut");
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string UniformCase::generateVertexSource (const vector<BasicUniform>& basicUniforms) const
{
	const bool			isVertexCase = m_caseShaderType == CASESHADERTYPE_VERTEX || m_caseShaderType == CASESHADERTYPE_BOTH;
	std::ostringstream	result;

	result << "#version 300 es\n"
			  "in highp vec4 a_position;\n"
			  "out mediump float v_vtxOut;\n"
			  "\n";

	if (isVertexCase)
		writeUniformDefinitions(result);

	result << "\n"
			  "void main (void)\n"
			  "{\n"
			  "	gl_Position = a_position;\n"
			  "	v_vtxOut = 1.0;\n";

	if (isVertexCase)
		writeUniformComparisons(result, basicUniforms, "v_vtxOut");

	result << "}\n";

	return result.str();
}